

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

ostream * __thiscall Polynomial::debug_display(Polynomial *this,ostream *o)

{
  pointer poVar1;
  int *piVar2;
  ostream *poVar3;
  ulong uVar4;
  int i;
  int iVar5;
  int *piVar6;
  int i_2;
  ulong uVar7;
  
  poVar3 = std::operator<<(o,"Polynomial: numstates=");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->mNumStates);
  poVar3 = std::operator<<(poVar3," numvars=");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->mNumVariables);
  poVar3 = std::operator<<(poVar3," evalValuesLength=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," resultLoc=");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->mResultLocation);
  poVar3 = std::operator<<(poVar3," firstOp=");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->mFirstOperation);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(o," program: ");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (iVar5 = 0; iVar5 < this->mNumStates; iVar5 = iVar5 + 1) {
    poVar3 = std::operator<<(o,"    ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar5);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar5);
    poVar3 = std::operator<<(poVar3," (constant)");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  for (iVar5 = 0; iVar5 < this->mNumVariables; iVar5 = iVar5 + 1) {
    poVar3 = std::operator<<(o,"    ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->mNumStates + iVar5);
    poVar3 = std::operator<<(poVar3," = x");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->mOperands).
                            super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->mOperands).
                            super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    poVar3 = std::operator<<(o,"    ");
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)poVar3,this->mFirstOperation + (int)uVar7);
    std::operator<<(poVar3," = ");
    uVar4 = (ulong)(this->mOperands).
                   super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar7].op;
    if (uVar4 < 6) {
      std::operator<<(o,&DAT_00119038 + *(int *)(&DAT_00119038 + uVar4 * 4));
    }
    poVar1 = (this->mOperands).
             super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = *(pointer *)
              ((long)&poVar1[uVar7].args.super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar6 = *(int **)&poVar1[uVar7].args.super__Vector_base<int,_std::allocator<int>_>._M_impl
        ; piVar6 != piVar2; piVar6 = piVar6 + 1) {
      iVar5 = *piVar6;
      poVar3 = std::operator<<(o," ");
      std::ostream::operator<<((ostream *)poVar3,iVar5);
    }
    std::endl<char,std::char_traits<char>>(o);
  }
  return o;
}

Assistant:

std::ostream& Polynomial::debug_display(std::ostream& o) const
{
  o << "Polynomial: numstates=" << mNumStates
    << " numvars=" << mNumVariables
    << " evalValuesLength=" << mEvaluationValues.size()
    << " resultLoc=" << mResultLocation
    << " firstOp=" << mFirstOperation << std::endl;
  o << " program: " << std::endl;
  for (int i=0; i<mNumStates; i++)
    o << "    " << i << " = " << i << " (constant)" << std::endl;
  for (int i=0; i<mNumVariables; i++)
    o << "    " << i+mNumStates << " = x" << i << std::endl;
  for (int i=0; i < mOperands.size(); i++)
    {
      o << "    " << mFirstOperation+i << " = ";
      switch (mOperands[i].op)
        {
        case operandType::PLUS:
          o << "PLUS";
          break;
        case operandType::TIMES:
          o << "TIMES";
          break;
        case operandType::POWER:
          o << "POWER";
          break;
        case operandType::MAX:
          o << "MAX";
          break;
        case operandType::MIN:
          o << "MIN";
          break;
        case operandType::NOT:
          o << "NOT";
          break;
        }
      for (auto a : mOperands[i].args)
        o << " " << a;
      o << std::endl;
      // o << " " << mOperands[i].first_arg << " " << mOperands[i].second_arg << std::endl;
    }
  return o;
}